

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_tree.hpp
# Opt level: O3

RowGroup * __thiscall
duckdb::SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
          (SegmentTree<duckdb::RowGroup,_true> *this,RowGroup *segment)

{
  RowGroup *pRVar1;
  SegmentLock l;
  unique_lock<std::mutex> local_28;
  
  if (((this->finished_loading)._M_base._M_i & 1U) == 0) {
    local_28._M_device = &this->node_lock;
    local_28._M_owns = false;
    ::std::unique_lock<std::mutex>::lock(&local_28);
    local_28._M_owns = true;
    if (segment == (RowGroup *)0x0) {
      pRVar1 = (RowGroup *)0x0;
    }
    else {
      pRVar1 = GetSegmentByIndex(this,(SegmentLock *)&local_28,
                                 (segment->super_SegmentBase<duckdb::RowGroup>).index + 1);
    }
    ::std::unique_lock<std::mutex>::~unique_lock(&local_28);
  }
  else {
    pRVar1 = (segment->super_SegmentBase<duckdb::RowGroup>).next._M_b._M_p;
  }
  return pRVar1;
}

Assistant:

T *GetNextSegment(T *segment) {
		if (!SUPPORTS_LAZY_LOADING) {
			return segment->Next();
		}
		if (finished_loading) {
			return segment->Next();
		}
		auto l = Lock();
		return GetNextSegment(l, segment);
	}